

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::batch_normalize
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  resizable_tensor *prVar4;
  resizable_tensor *this;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ostream *poVar11;
  fatal_error *pfVar12;
  long lVar13;
  float *d;
  long lVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  tensor *__range2_1;
  float fVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  tensor *__range2;
  ostringstream dlib_o_out;
  string local_238;
  resizable_tensor *local_210;
  double local_208;
  resizable_tensor *local_200;
  resizable_tensor *local_1f8;
  tensor *local_1f0;
  tensor *local_1e8;
  double local_1e0;
  undefined1 local_1d8 [24];
  ulong uStack_1c0;
  undefined8 *local_60;
  float local_58;
  string *local_50;
  float local_48;
  undefined8 **local_40;
  string **local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  if ((averaging_factor < 0.0) || (1.0 < averaging_factor)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"\n\nError detected at line ",0x19);
    poVar11 = (ostream *)std::ostream::operator<<(local_1d8,0x2d1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"0 <= averaging_factor && averaging_factor <= 1",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
    *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) =
         *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"averaging_factor: ",0x12);
    poVar11 = std::ostream::_M_insert<double>(averaging_factor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_238);
    __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
  }
  if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
    if (((running_means->super_tensor).m_n != (means->super_tensor).m_n) ||
       ((((running_means->super_tensor).m_k != (means->super_tensor).m_k ||
         ((running_means->super_tensor).m_nr != (means->super_tensor).m_nr)) ||
        ((running_means->super_tensor).m_nc != (means->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\n\nError detected at line ",0x19);
      poVar11 = (ostream *)std::ostream::operator<<(local_1d8,0x2d2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xcf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "averaging_factor==1 || have_same_dimensions(running_means,means)",0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
      *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) =
           *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
      pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_238);
      __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
    }
    if (((averaging_factor != 1.0) || (NAN(averaging_factor))) &&
       ((((running_variances->super_tensor).m_n != (invstds->super_tensor).m_n ||
         (((running_variances->super_tensor).m_k != (invstds->super_tensor).m_k ||
          ((running_variances->super_tensor).m_nr != (invstds->super_tensor).m_nr)))) ||
        ((running_variances->super_tensor).m_nc != (invstds->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\n\nError detected at line ",0x19);
      poVar11 = (ostream *)std::ostream::operator<<(local_1d8,0x2d3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xcf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "averaging_factor==1 || have_same_dimensions(running_variances,invstds)",0x46);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
      *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) =
           *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\n",1);
      pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_238);
      __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
    }
  }
  lVar7 = src->m_n;
  local_208 = eps;
  if ((((((lVar7 < 2) || (gamma->m_n != 1)) || (beta->m_n != 1)) ||
       ((gamma->m_nr != beta->m_nr || (lVar8 = src->m_nr, beta->m_nr != lVar8)))) ||
      ((gamma->m_nc != beta->m_nc ||
       ((lVar20 = src->m_nc, beta->m_nc != lVar20 || (gamma->m_k != beta->m_k)))))) ||
     ((eps <= 0.0 || (lVar14 = src->m_k, beta->m_k != lVar14)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"\n\nError detected at line ",0x19);
    poVar11 = (ostream *)std::ostream::operator<<(local_1d8,0x2e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == beta.nr() && beta.nr() == src.nr() && gamma.nc() == beta.nc() && beta.nc() == src.nc() && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
               ,0xef);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,".\n",2);
    *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) =
         *(uint *)((long)&uStack_1c0 + (long)*(_func_int **)(local_1d8._0_8_ + -0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"\ngamma.num_samples(): ",0x16);
    poVar11 = std::ostream::_M_insert<long>((long)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngamma.k():  ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngamma.nr(): ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngamma.nc(): ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbeta.num_samples(): ",0x15);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbeta.k():   ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbeta.nr():  ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbeta.nc():  ",0xd);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nsrc.k():   ",0xc);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nsrc.nr():  ",0xc);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nsrc.nc():  ",0xc);
    poVar11 = std::ostream::_M_insert<long>((long)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\neps:  ",7);
    poVar11 = std::ostream::_M_insert<double>(local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_238);
    __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
  }
  local_1f0 = gamma;
  local_1e8 = beta;
  (dest->super_tensor).m_n = lVar7;
  (dest->super_tensor).m_k = lVar14;
  (dest->super_tensor).m_nr = lVar8;
  (dest->super_tensor).m_nc = lVar20;
  sVar15 = lVar20 * lVar14 * lVar8 * lVar7;
  (dest->super_tensor).m_size = sVar15;
  local_200 = dest;
  gpu_data::set_size(&dest->data_instance,sVar15);
  lVar7 = src->m_k;
  lVar8 = src->m_nr;
  lVar20 = src->m_nc;
  (means->super_tensor).m_n = 1;
  (means->super_tensor).m_k = lVar7;
  (means->super_tensor).m_nr = lVar8;
  (means->super_tensor).m_nc = lVar20;
  sVar15 = lVar8 * lVar7 * lVar20;
  (means->super_tensor).m_size = sVar15;
  gpu_data::set_size(&means->data_instance,sVar15);
  lVar7 = src->m_k;
  lVar8 = src->m_nr;
  lVar20 = src->m_nc;
  (invstds->super_tensor).m_n = 1;
  (invstds->super_tensor).m_k = lVar7;
  (invstds->super_tensor).m_nr = lVar8;
  (invstds->super_tensor).m_nc = lVar20;
  sVar15 = lVar8 * lVar7 * lVar20;
  (invstds->super_tensor).m_size = sVar15;
  gpu_data::set_size(&invstds->data_instance,sVar15);
  iVar5 = (*(means->super_tensor)._vptr_tensor[4])(means);
  lVar7 = (means->super_tensor).m_size;
  if (lVar7 != 0) {
    memset((void *)CONCAT44(extraout_var,iVar5),0,lVar7 << 2);
  }
  local_1f8 = running_means;
  iVar5 = (*(invstds->super_tensor)._vptr_tensor[4])(invstds);
  lVar7 = (invstds->super_tensor).m_size;
  if (lVar7 != 0) {
    memset((void *)CONCAT44(extraout_var_00,iVar5),0,lVar7 << 2);
  }
  iVar5 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  lVar7 = CONCAT44(extraout_var_01,iVar5);
  local_210 = means;
  iVar5 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar8 = CONCAT44(extraout_var_02,iVar5);
  iVar5 = (*src->_vptr_tensor[2])(src);
  prVar4 = local_210;
  pfVar9 = (float *)CONCAT44(extraout_var_03,iVar5);
  lVar20 = src->m_k * src->m_nr * src->m_nc;
  if (0 < lVar20) {
    lVar14 = src->m_n;
    lVar16 = 0;
    do {
      pfVar10 = pfVar9;
      lVar19 = lVar14;
      if (0 < lVar14) {
        do {
          fVar21 = *pfVar10;
          *(float *)(lVar8 + lVar16 * 4) = *(float *)(lVar8 + lVar16 * 4) + fVar21;
          *(float *)(lVar7 + lVar16 * 4) = fVar21 * fVar21 + *(float *)(lVar7 + lVar16 * 4);
          pfVar10 = pfVar10 + lVar20;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      lVar16 = lVar16 + 1;
      pfVar9 = pfVar9 + 1;
    } while (lVar16 != lVar20);
  }
  lVar14 = src->m_n;
  iVar5 = (*(local_210->super_tensor)._vptr_tensor[3])(local_210);
  pfVar10 = (float *)CONCAT44(extraout_var_04,iVar5);
  iVar5 = (*(prVar4->super_tensor)._vptr_tensor[3])(prVar4);
  pfVar9 = (float *)(CONCAT44(extraout_var_05,iVar5) + (prVar4->super_tensor).m_size * 4);
  if (pfVar10 != pfVar9) {
    do {
      *pfVar10 = *pfVar10 * (1.0 / (float)lVar14);
      pfVar10 = pfVar10 + 1;
    } while (pfVar10 != pfVar9);
  }
  lVar14 = src->m_n;
  iVar5 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  pfVar10 = (float *)CONCAT44(extraout_var_06,iVar5);
  iVar5 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  pfVar9 = (float *)(CONCAT44(extraout_var_07,iVar5) + (invstds->super_tensor).m_size * 4);
  if (pfVar10 != pfVar9) {
    do {
      *pfVar10 = *pfVar10 * (1.0 / (float)lVar14);
      pfVar10 = pfVar10 + 1;
    } while (pfVar10 != pfVar9);
  }
  (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  (*(local_210->super_tensor)._vptr_tensor[3])();
  lVar14 = (invstds->super_tensor).m_n;
  lVar16 = (invstds->super_tensor).m_k;
  lVar19 = (invstds->super_tensor).m_nr;
  lVar13 = (invstds->super_tensor).m_nc;
  (running_variances->super_tensor).m_n = lVar14;
  (running_variances->super_tensor).m_k = lVar16;
  (running_variances->super_tensor).m_nr = lVar19;
  (running_variances->super_tensor).m_nc = lVar13;
  sVar15 = lVar19 * lVar13 * lVar16 * lVar14;
  (running_variances->super_tensor).m_size = sVar15;
  gpu_data::set_size(&running_variances->data_instance,sVar15);
  iVar5 = (*(running_variances->super_tensor)._vptr_tensor[3])(running_variances);
  if (0 < lVar20) {
    dVar22 = (double)src->m_n / ((double)src->m_n + -1.0);
    local_1e0 = dVar22 * averaging_factor;
    lVar14 = 0;
    dVar24 = local_208;
    do {
      fVar21 = *(float *)(lVar8 + lVar14 * 4);
      dVar3 = (double)(*(float *)(lVar7 + lVar14 * 4) - fVar21 * fVar21);
      if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
        dVar23 = local_1e0 * dVar3 +
                 (double)*(float *)(CONCAT44(extraout_var_08,iVar5) + lVar14 * 4) *
                 (1.0 - averaging_factor);
      }
      else {
        dVar23 = dVar22 * dVar3;
      }
      *(float *)(CONCAT44(extraout_var_08,iVar5) + lVar14 * 4) = (float)dVar23;
      dVar3 = dVar3 + dVar24;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
        dVar24 = local_208;
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      *(float *)(lVar7 + lVar14 * 4) = (float)(1.0 / dVar3);
      lVar14 = lVar14 + 1;
    } while (lVar20 - lVar14 != 0);
  }
  iVar5 = (*src->_vptr_tensor[2])();
  lVar16 = CONCAT44(extraout_var_09,iVar5);
  iVar5 = (*(local_200->super_tensor)._vptr_tensor[3])();
  lVar19 = CONCAT44(extraout_var_10,iVar5);
  iVar5 = (*local_1f0->_vptr_tensor[2])();
  iVar6 = (*local_1e8->_vptr_tensor[2])();
  this = local_1f8;
  prVar4 = local_210;
  lVar14 = src->m_n;
  if (0 < lVar14) {
    lVar13 = 0;
    do {
      if (0 < lVar20) {
        lVar17 = 0;
        lVar18 = 0;
        do {
          fVar21 = (*(float *)(lVar16 + lVar18 * 4) - *(float *)(lVar8 + lVar18 * 4)) *
                   *(float *)(lVar7 + lVar18 * 4);
          *(float *)(lVar19 + lVar18 * 4) = fVar21;
          *(float *)(lVar19 + lVar18 * 4) =
               fVar21 * *(float *)(CONCAT44(extraout_var_11,iVar5) + lVar18 * 4) +
               *(float *)(CONCAT44(extraout_var_12,iVar6) + lVar18 * 4);
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + -4;
        } while (lVar20 - lVar18 != 0);
        lVar19 = lVar19 - lVar17;
        lVar16 = lVar16 - lVar17;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar14);
  }
  lVar7 = (local_210->super_tensor).m_n;
  lVar8 = (local_210->super_tensor).m_k;
  lVar20 = (local_210->super_tensor).m_nr;
  lVar14 = (local_210->super_tensor).m_nc;
  (local_1f8->super_tensor).m_n = lVar7;
  (local_1f8->super_tensor).m_k = lVar8;
  (local_1f8->super_tensor).m_nr = lVar20;
  (local_1f8->super_tensor).m_nc = lVar14;
  sVar15 = lVar20 * lVar14 * lVar8 * lVar7;
  (local_1f8->super_tensor).m_size = sVar15;
  gpu_data::set_size(&local_1f8->data_instance,sVar15);
  if ((averaging_factor == 1.0) && (!NAN(averaging_factor))) {
    resizable_tensor::operator=(this,prVar4);
    return;
  }
  uVar1 = (this->super_tensor).m_size;
  if (uVar1 == 0) {
    uStack_1c0 = 0;
    local_1d8._0_8_ = (_func_int **)0x0;
    local_1d8._8_8_ = 0;
  }
  else {
    uVar2 = (this->super_tensor).m_n;
    iVar5 = (*(this->super_tensor)._vptr_tensor[2])(this);
    local_1d8._0_8_ = CONCAT44(extraout_var_13,iVar5);
    local_1d8._8_8_ = uVar2;
    uStack_1c0 = uVar1 / uVar2;
  }
  local_58 = (float)(1.0 - averaging_factor);
  local_60 = (undefined8 *)local_1d8;
  uVar1 = (prVar4->super_tensor).m_size;
  local_1d8._16_8_ = uStack_1c0;
  if (uVar1 == 0) {
    local_238.field_2._8_8_ = 0;
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
  }
  else {
    uVar2 = (prVar4->super_tensor).m_n;
    iVar5 = (*(prVar4->super_tensor)._vptr_tensor[2])(prVar4);
    local_238._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_14,iVar5);
    local_238._M_string_length = uVar2;
    local_238.field_2._8_8_ = uVar1 / uVar2;
  }
  local_48 = (float)averaging_factor;
  local_50 = &local_238;
  local_38 = &local_50;
  local_40 = &local_60;
  local_238.field_2._0_8_ = local_238.field_2._8_8_;
  resizable_tensor::operator=
            (this,(matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                   *)&local_40);
  return;
}

Assistant:

void batch_normalize (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == beta.nr() && beta.nr() == src.nr() &&
                gamma.nc() == beta.nc() && beta.nc() == src.nc() &&
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k(), src.nr(), src.nc());
            invstds.set_size(1, src.k(), src.nr(), src.nc());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            auto p_src = src.host();
            const long num = src.k()*src.nr()*src.nc();
            // compute means, and sum of squares
            for (long i = 0; i < num; ++i)
            {
                for (long n = 0; n < src.num_samples(); ++n)
                {
                    float val = p_src[n*num+i];
                    p_means[i] += val;
                    p_invstds[i] += val*val;
                }
            }
            means /= src.num_samples();
            invstds /= src.num_samples();
            // copy data back to host
            invstds.host(); means.host();

            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples())/(src.num_samples()-1.0);
            for (long i = 0; i < num; ++i)
            {
                auto actual_var = p_invstds[i] - p_means[i]*p_means[i];
                if (averaging_factor == 1)
                    rvar[i] = scale*actual_var;
                else
                    rvar[i] = (1-averaging_factor)*rvar[i] + scale*averaging_factor*actual_var;

                p_invstds[i] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    *p_dest = (*p_src - p_means[i])*p_invstds[i];
                    *p_dest = (*p_dest)*p_gamma[i] + p_beta[i];
                    ++p_src;
                    ++p_dest;
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }